

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_3,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,4,3>
          (Matrix<float,_3,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_3> *a,
          Vector<float,_4> *b)

{
  float fVar1;
  Matrix<float,_3,_4> *pMVar2;
  float *pfVar3;
  undefined8 *puVar4;
  int r;
  long lVar5;
  int row;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  undefined8 uStack_38;
  Matrix<float,_4,_3> retVal;
  long lVar9;
  
  pMVar2 = __return_storage_ptr__;
  pfVar3 = retVal.m_data.m_data[0].m_data + 2;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[0].m_data[3] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  uStack_38 = 0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar8 = _DAT_019f34d0;
    do {
      bVar10 = SUB164(auVar8 ^ _DAT_019ec5b0,4) == -0x80000000 &&
               SUB164(auVar8 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar5 != lVar7) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar7 + -0x10) = uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar5 + -0x10 != lVar7) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar7) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pfVar3 = pfVar3 + 1;
  } while (lVar6 != 4);
  puVar4 = &uStack_38;
  lVar5 = 0;
  do {
    fVar1 = a->m_data[lVar5];
    lVar6 = 0;
    do {
      *(float *)((long)puVar4 + lVar6 * 4) = *(float *)(this + lVar6) * fVar1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    lVar5 = lVar5 + 1;
    puVar4 = (undefined8 *)((long)puVar4 + 4);
  } while (lVar5 != 4);
  *(undefined1 (*) [16])((__return_storage_ptr__->m_data).m_data[2].m_data + 2) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((__return_storage_ptr__->m_data).m_data[1].m_data + 1) =
       (undefined1  [16])0x0;
  (__return_storage_ptr__->m_data).m_data[0] = (float  [3])0x0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar7) = uVar11;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x30);
    lVar6 = lVar6 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar6 != 3);
  puVar4 = &uStack_38;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(undefined4 *)
       ((long)((Vector<tcu::Vector<float,_3>,_4> *)
              ((Vector<float,_3> *)__return_storage_ptr__)->m_data)->m_data[0].m_data + lVar6) =
           *(undefined4 *)((long)puVar4 + lVar6 * 4);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    lVar5 = lVar5 + 1;
    __return_storage_ptr__ = (Matrix<float,_3,_4> *)((long)__return_storage_ptr__ + 0xc);
    puVar4 = (undefined8 *)((long)puVar4 + 4);
  } while (lVar5 != 4);
  return pMVar2;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}